

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void gl4cts::FunctionObject::unpack<tcu::Matrix<double,_3,_4>_>::get
               (GLvoid *buffer,Matrix<double,_3,_4> *out)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_28;
  GLint index;
  GLint row;
  GLint column;
  GLdouble *data;
  Matrix<double,_3,_4> *out_local;
  GLvoid *buffer_local;
  
  for (index = 0; index < 4; index = index + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      dVar1 = *(double *)((long)buffer + (long)(index * 3 + local_28) * 8);
      pdVar2 = tcu::Matrix<double,_3,_4>::operator()(out,local_28,index);
      *pdVar2 = dVar1;
    }
  }
  return;
}

Assistant:

static void get(const glw::GLvoid* buffer, tcu::Matrix<glw::GLdouble, Rows, Cols>& out)
	{
		const glw::GLdouble* data = (glw::GLdouble*)buffer;

		for (glw::GLint column = 0; column < Cols; ++column)
		{
			for (glw::GLint row = 0; row < Rows; ++row)
			{
				glw::GLint index = column * Rows + row;

				out(row, column) = data[index];
			}
		}
	}